

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::TailCall(SQVM *this,SQClosure *closure,SQInteger parambase,SQInteger nparams)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  SQObjectPtr *pSVar7;
  long *plVar8;
  long lVar9;
  bool bVar10;
  CallInfo *pCVar11;
  long lVar12;
  SQInteger SVar13;
  SQObjectPtr clo;
  SQObjectPtr local_40;
  
  lVar5 = this->_top;
  local_40.super_SQObject._type = OT_CLOSURE;
  pSVar1 = &(closure->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  pCVar11 = this->ci;
  local_40.super_SQObject._unVal.pClosure = closure;
  if (pCVar11->_root == 0) {
    if (0 < nparams) {
      lVar12 = 8;
      SVar13 = nparams;
      do {
        lVar6 = this->_stackbase;
        pSVar7 = (this->_stack)._vals;
        uVar3 = *(uint *)((long)pSVar7 + lVar12 + -8 + lVar6 * 0x10);
        plVar8 = *(long **)((long)&pSVar7[lVar6].super_SQObject._type + lVar12);
        lVar9 = *(long *)((long)&pSVar7[lVar6 + parambase].super_SQObject._type + lVar12);
        *(long *)((long)&pSVar7[lVar6].super_SQObject._type + lVar12) = lVar9;
        uVar4 = *(uint *)((long)pSVar7 + parambase * 0x10 + -8 + lVar12 + lVar6 * 0x10);
        *(uint *)((long)pSVar7 + lVar12 + -8 + lVar6 * 0x10) = uVar4;
        if ((uVar4 >> 0x1b & 1) != 0) {
          plVar2 = (long *)(lVar9 + 8);
          *plVar2 = *plVar2 + 1;
        }
        if ((uVar3 >> 0x1b & 1) != 0) {
          plVar2 = plVar8 + 1;
          *plVar2 = *plVar2 + -1;
          if (*plVar2 == 0) {
            (**(code **)(*plVar8 + 0x10))();
          }
        }
        lVar12 = lVar12 + 0x10;
        SVar13 = SVar13 + -1;
      } while (SVar13 != 0);
      pCVar11 = this->ci;
    }
    bVar10 = StartCall(this,closure,(long)pCVar11->_target,nparams,this->_stackbase,true);
    if (this->_top <= lVar5) {
      this->_top = lVar5;
    }
  }
  else {
    bVar10 = false;
    Raise_Error(this,"root calls cannot invoke tailcalls");
  }
  SQObjectPtr::~SQObjectPtr(&local_40);
  return bVar10;
}

Assistant:

bool SQVM::TailCall(SQClosure *closure, SQInteger parambase,SQInteger nparams)
{
	SQInteger last_top = _top;
	SQObjectPtr clo = closure;
	if (ci->_root)
	{
		Raise_Error("root calls cannot invoke tailcalls");
		return false;
	}
	for (SQInteger i = 0; i < nparams; i++) STK(i) = STK(parambase + i);
	bool ret = StartCall(closure, ci->_target, nparams, _stackbase, true);
	if (last_top >= _top) {
		_top = last_top;
	}
	return ret;
}